

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.h
# Opt level: O2

void __thiscall libDAI::MaxPlus::MaxPlus(MaxPlus *this,MaxPlus *x)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 uVar4;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,&x->super_DAIAlgFG);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f840;
  uVar4 = *(undefined4 *)&(x->Props).field_0x4;
  dVar1 = (x->Props).tol;
  sVar2 = (x->Props).maxiter;
  sVar3 = (x->Props).verbose;
  (this->Props).updates = (UpdateType)(x->Props).updates.v;
  *(undefined4 *)&(this->Props).field_0x4 = uVar4;
  (this->Props).tol = dVar1;
  (this->Props).maxiter = sVar2;
  (this->Props).verbose = sVar3;
  (this->Props).damping = (x->Props).damping;
  this->_maxdiff = x->_maxdiff;
  this->_iterations = x->_iterations;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_indices,&x->_indices);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (&this->_messages,&x->_messages);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (&this->_newmessages,&x->_newmessages);
  this->_g = x->_g;
  (this->bestConfiguration).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bestConfiguration).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bestConfiguration).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

MaxPlus & operator=( const MaxPlus & x ) {
                if( this != &x ) {
                    DAIAlgFG::operator=( x );
                    Props        = x.Props;
                    _maxdiff     = x._maxdiff;
                    _iterations  = x._iterations;
                    _indices     = x._indices;
                    _messages    = x._messages;
                    _newmessages = x._newmessages;
                }
                return *this;
            }